

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata.cpp
# Opt level: O1

void LoadMapinfoACSLump(void)

{
  level_info_t *plVar1;
  Node *pNVar2;
  uint uVar3;
  int lumpnum;
  FOptionalMapinfoData *pFVar4;
  Node *pNVar5;
  
  plVar1 = level.info;
  uVar3 = FName::NameManager::FindName(&FName::NameData,"EData",false);
  pNVar2 = (plVar1->optdata).Nodes + ((plVar1->optdata).Size - 1 & uVar3);
  while ((pNVar5 = pNVar2, pNVar5 != (Node *)0x0 && (pNVar5->Next != (Node *)0x1))) {
    pNVar2 = pNVar5->Next;
    if ((pNVar5->Pair).Key.Index == uVar3) {
LAB_00383881:
      if (pNVar5 == (Node *)0x0) {
        pFVar4 = (FOptionalMapinfoData *)0x0;
      }
      else {
        pFVar4 = (pNVar5->Pair).Value.Ptr;
      }
      if ((pFVar4 != (FOptionalMapinfoData *)0x0) &&
         (lumpnum = FWadCollection::CheckNumForName(&Wads,(char *)pFVar4[1].Next,0), -1 < lumpnum))
      {
        FBehavior::StaticLoadModule(lumpnum,(FileReader *)0x0,0);
        return;
      }
      return;
    }
  }
  pNVar5 = (Node *)0x0;
  goto LAB_00383881;
}

Assistant:

void LoadMapinfoACSLump()
{
	FEDOptions *opt = level.info->GetOptData<FEDOptions>("EData", false);
	if (opt != NULL)
	{
		int lump = Wads.CheckNumForName(opt->acsName);
		if (lump >= 0) FBehavior::StaticLoadModule(lump);
	}
}